

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

int32_t __thiscall
icu_63::CollationBuilder::insertTailoredNodeAfter
          (CollationBuilder *this,int32_t index,int32_t strength,UErrorCode *errorCode)

{
  int iVar1;
  int64_t *piVar2;
  uint uVar3;
  int32_t iVar4;
  ulong uVar6;
  ulong uVar7;
  ulong uVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar5 = (ulong)(uint)index;
  if (0 < strength) {
    uVar3 = findCommonNode(this,index,1);
    uVar5 = (ulong)uVar3;
    if (strength != 1) {
      uVar3 = findCommonNode(this,uVar3,2);
      uVar5 = (ulong)uVar3;
    }
  }
  iVar1 = (this->nodes).count;
  piVar2 = (this->nodes).elements;
  if ((int)uVar5 < iVar1 && -1 < (int)uVar5) {
    uVar7 = piVar2[uVar5];
  }
  else {
    uVar7 = 0;
  }
  do {
    uVar6 = uVar5;
    uVar3 = (uint)(uVar7 >> 8) & 0xfffff;
    if ((uVar7 >> 8 & 0xfffff) == 0) break;
    if ((int)uVar3 < iVar1) {
      uVar7 = piVar2[uVar3];
    }
    else {
      uVar7 = 0;
    }
    uVar5 = (ulong)uVar3;
  } while (strength < (int)((uint)uVar7 & 3));
  iVar4 = insertNodeBetween(this,(int32_t)uVar6,uVar3,(long)(int)(strength | 8),errorCode);
  return iVar4;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }